

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

duckdb_decimal * __thiscall
duckdb::TryCastCInternal<char*,duckdb_decimal,duckdb::FromCStringCastWrapper<duckdb::TryCast>>
          (duckdb_decimal *__return_storage_ptr__,duckdb *this,duckdb_result *result,idx_t col,
          idx_t row)

{
  bool bVar1;
  duckdb_decimal result_value;
  duckdb_decimal local_20;
  
  bVar1 = FromCStringCastWrapper<duckdb::TryCast>::Operation<char*,duckdb_decimal>
                    (*(char **)(*(long *)(*(long *)(this + 0x18) + (long)result * 0x28) + col * 8),
                     &local_20);
  if (bVar1) {
    (__return_storage_ptr__->value).upper = local_20.value.upper;
    __return_storage_ptr__->width = local_20.width;
    __return_storage_ptr__->scale = local_20.scale;
    *(undefined6 *)&__return_storage_ptr__->field_0x2 = local_20._2_6_;
    (__return_storage_ptr__->value).lower = local_20.value.lower;
  }
  else {
    FetchDefaultValue::Operation<duckdb_decimal>();
  }
  return __return_storage_ptr__;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}